

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
flow::Program::handlerNames_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Program *this)

{
  pointer puVar1;
  unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_> *handler;
  pointer puVar2;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,
            (long)(this->handlers_).
                  super__Vector_base<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>,_std::allocator<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->handlers_).
                  super__Vector_base<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>,_std::allocator<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar1 = (this->handlers_).
           super__Vector_base<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>,_std::allocator<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->handlers_).
                super__Vector_base<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>,_std::allocator<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               &((puVar2->_M_t).
                 super___uniq_ptr_impl<flow::Handler,_std::default_delete<flow::Handler>_>._M_t.
                 super__Tuple_impl<0UL,_flow::Handler_*,_std::default_delete<flow::Handler>_>.
                 super__Head_base<0UL,_flow::Handler_*,_false>._M_head_impl)->name_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Program::handlerNames() const {
  std::vector<std::string> result;
  result.reserve(handlers_.size());

  for (auto& handler: handlers_)
    result.emplace_back(handler->name());

  return result;
}